

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_bytecodeJit_addSourcePositionRecordWith
               (sysbvm_bytecodeJit_t *jit,size_t nativePC,sysbvm_tuple_t sourcePosition)

{
  _Bool _Var1;
  size_t local_40;
  sysbvm_bytecodeJitSourcePositionRecord_t newRecord;
  sysbvm_bytecodeJitSourcePositionRecord_t *existingRecords;
  sysbvm_tuple_t sourcePosition_local;
  size_t nativePC_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (((jit->sourcePositions).size == 0) ||
     (newRecord._16_8_ = (jit->sourcePositions).data,
     *(sysbvm_tuple_t *)(newRecord._16_8_ + ((jit->sourcePositions).size - 1) * 0x18 + 8) !=
     sourcePosition)) {
    memset(&local_40,0,0x18);
    local_40 = nativePC;
    newRecord.pc = sourcePosition;
    _Var1 = sysbvm_sourcePosition_getStartLineAndColumn
                      (jit->context,sourcePosition,(uint32_t *)&newRecord.sourcePosition,
                       (uint32_t *)((long)&newRecord.sourcePosition + 4));
    if (_Var1) {
      sysbvm_dynarray_add(&jit->sourcePositions,&local_40);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_addSourcePositionRecordWith(sysbvm_bytecodeJit_t *jit, size_t nativePC, sysbvm_tuple_t sourcePosition)
{
    if(jit->sourcePositions.size)
    {
        sysbvm_bytecodeJitSourcePositionRecord_t *existingRecords = (sysbvm_bytecodeJitSourcePositionRecord_t*)jit->sourcePositions.data;
        if(existingRecords[jit->sourcePositions.size - 1].sourcePosition == sourcePosition)
            return;
    }

    sysbvm_bytecodeJitSourcePositionRecord_t newRecord = {0};
    newRecord.sourcePosition = sourcePosition;
    newRecord.pc = nativePC;
    if(!sysbvm_sourcePosition_getStartLineAndColumn(jit->context, sourcePosition, &newRecord.line, &newRecord.column))
        return;

    sysbvm_dynarray_add(&jit->sourcePositions, &newRecord);
}